

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O3

void __thiscall xray_re::xr_sound_thumbnail::load(xr_sound_thumbnail *this,xr_reader *r)

{
  float *pfVar1;
  uint32_t *puVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uint16_t version;
  uint32_t type;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  sVar3 = xr_reader::r_raw_chunk(r,0x810,(void *)((long)&uStack_18 + 2),2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x10,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  if (uStack_18._2_2_ != 0x14) {
    __assert_fail("version == THM_VERSION_SOUNDPARAM",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x11,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  sVar3 = xr_reader::r_raw_chunk(r,0x813,(void *)((long)&uStack_18 + 4),4);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x15,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  if (uStack_18._4_4_ == 2) {
    sVar3 = xr_reader::find_chunk(r,0x1000);
    if (sVar3 != 0) {
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->quality = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->min_dist = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->max_dist = *pfVar1;
      puVar2 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
      this->game_type = *puVar2;
      sVar3 = xr_reader::find_chunk(r,0x1001);
      if (sVar3 != 0) {
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->base_volume = *pfVar1;
      }
      sVar3 = xr_reader::find_chunk(r,0x1002);
      if (sVar3 != 0) {
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->max_ai_dist = *pfVar1;
      }
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x19,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  __assert_fail("type == THM_TYPE_SOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                ,0x16,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
}

Assistant:

void xr_sound_thumbnail::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(THM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == THM_VERSION_SOUNDPARAM);

	uint32_t type;
	if (!r.r_chunk(THM_CHUNK_TYPE, type))
		xr_not_expected();
	xr_assert(type == THM_TYPE_SOUND);

	if (!r.find_chunk(THM_CHUNK_SOUNDPARAM))
		xr_not_expected();
	quality = r.r_float();
	min_dist = r.r_float();
	max_dist = r.r_float();
	game_type = r.r_u32();
	r.debug_find_chunk();

	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_VOLUME)) {
		base_volume = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_AI)) {
		max_ai_dist = r.r_float();
		r.debug_find_chunk();
	}
}